

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadElementSection(WasmBinaryReader *this)

{
  WasmNode initExpr_00;
  bool bVar1;
  uint uVar2;
  uint sourceContextId;
  LocalFunctionId functionId;
  uint numElem;
  Type funcType;
  WasmElementSegment *this_00;
  char16_t *pcVar3;
  FunctionBody *pFVar4;
  WasmBinaryReader *pWVar5;
  uint32 index;
  ulong uVar6;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 auStack_60 [8];
  WasmNode initExpr;
  uint32 local_38;
  uint local_34;
  uint32 length;
  
  local_38 = 0;
  pWVar5 = this;
  uVar2 = LEB128<unsigned_int,32u>(this,&local_38);
  if ((10000000 < uVar2) && (DAT_01430302 == '\0')) {
    pcVar3 = L"Too many element segments";
LAB_00d6428f:
    ThrowDecodingError(pWVar5,pcVar3);
  }
  if (uVar2 != 0) {
    Js::WebAssemblyModule::AllocateElementSegs(this->m_module,uVar2);
  }
  pFVar4 = (this->m_funcState).body;
  if (pFVar4 == (FunctionBody *)0x0 || this->m_readerState != READER_STATE_FUNCTION) {
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,WasmReaderPhase);
  }
  else {
    sourceContextId = Js::FunctionProxy::GetSourceContextId((FunctionProxy *)pFVar4);
    if (this->m_readerState == READER_STATE_FUNCTION) {
      pFVar4 = (this->m_funcState).body;
    }
    else {
      pFVar4 = (FunctionBody *)0x0;
    }
    functionId = Js::FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar4);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01453738,WasmReaderPhase,sourceContextId,functionId);
  }
  if (bVar1 != false) {
    Output::Print(L"Indirect table element: %u entries",(ulong)uVar2);
    Output::Print(L"\n");
    Output::Flush();
  }
  uVar6 = 0;
  local_34 = uVar2;
  do {
    if ((uint)uVar6 == local_34) {
      return;
    }
    pWVar5 = this;
    uVar2 = LEB128<unsigned_int,32u>(this,&local_38);
    if ((uVar2 != 0) ||
       (((this->m_module->field_0x20 & 1) == 0 &&
        ((this->m_module->m_tableImport).ptr == (WasmImport *)0x0)))) {
      pcVar3 = L"Unknown table index %d";
LAB_00d64276:
      ThrowDecodingError(pWVar5,pcVar3,(ulong)uVar2);
    }
    initExpr.field_1._16_8_ = uVar6;
    ReadInitExpr((WasmNode *)auStack_60,this,true);
    pWVar5 = this;
    numElem = LEB128<unsigned_int,32u>(this,&local_38);
    if ((DAT_01430302 == '\0') && (DAT_01430308 < numElem)) {
      pcVar3 = L"Too many table element";
      goto LAB_00d6428f;
    }
    this_00 = (WasmElementSegment *)new<Memory::ArenaAllocator>(0x48,this->m_alloc,0x35916e);
    initExpr_00.field_1.block = initExpr.field_1.block;
    initExpr_00.op = initExpr.op;
    initExpr_00._2_6_ = initExpr._2_6_;
    initExpr_00.field_1.brTable.targetTable = initExpr.field_1.brTable.targetTable;
    initExpr_00.field_1._16_8_ = in_stack_ffffffffffffff98;
    WasmElementSegment::WasmElementSegment(this_00,this->m_alloc,0,initExpr_00,numElem);
    while (bVar1 = numElem != 0, numElem = numElem - 1, bVar1) {
      uVar2 = LEB128<unsigned_int,32u>(this,&local_38);
      funcType = Js::WebAssemblyModule::GetFunctionIndexType(this->m_module,uVar2);
      pWVar5 = (WasmBinaryReader *)(ulong)(uint)funcType;
      bVar1 = FunctionIndexTypes::CanBeExported(funcType);
      if (!bVar1) {
        pcVar3 = L"Invalid function to insert in the table %u";
        goto LAB_00d64276;
      }
      WasmElementSegment::AddElement(this_00,uVar2);
    }
    index = (uint32)initExpr.field_1._16_8_;
    Js::WebAssemblyModule::SetElementSeg(this->m_module,this_00,index);
    uVar6 = (ulong)(index + 1);
  } while( true );
}

Assistant:

void WasmBinaryReader::ReadElementSection()
{
    uint32 length = 0;
    uint32 numSegments = LEB128(length);
    if (numSegments > Limits::GetMaxElementSegments())
    {
        ThrowDecodingError(_u("Too many element segments"));
    }

    if (numSegments > 0)
    {
        m_module->AllocateElementSegs(numSegments);
    }
    TRACE_WASM_DECODER(_u("Indirect table element: %u entries"), numSegments);

    for (uint32 i = 0; i < numSegments; ++i)
    {
        uint32 index = LEB128(length); // Table id
        if (index != 0 || !(m_module->HasTable() || m_module->HasTableImport()))
        {
            ThrowDecodingError(_u("Unknown table index %d"), index); //MVP limitation
        }

        WasmNode initExpr = ReadInitExpr(true);
        uint32 numElem = LEB128(length);

        if (numElem > Limits::GetMaxTableSize())
        {
            ThrowDecodingError(_u("Too many table element"));
        }

        WasmElementSegment* eSeg = Anew(m_alloc, WasmElementSegment, m_alloc, index, initExpr, numElem);

        for (uint32 iElem = 0; iElem < numElem; ++iElem)
        {
            uint32 elem = LEB128(length);
            FunctionIndexTypes::Type funcType = m_module->GetFunctionIndexType(elem);
            if (!FunctionIndexTypes::CanBeExported(funcType))
            {
                ThrowDecodingError(_u("Invalid function to insert in the table %u"), elem);
            }
            eSeg->AddElement(elem);
        }
        m_module->SetElementSeg(eSeg, i);
    }
}